

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translator.c
# Opt level: O3

void translator_loop_m68k
               (TranslatorOps_conflict *ops,DisasContextBase_conflict *db,CPUState *cpu,
               TranslationBlock *tb,int max_insns)

{
  undefined4 uVar1;
  uc_struct_conflict7 *val;
  TCGContext_conflict6 *s;
  void *pvVar2;
  hook *phVar3;
  TranslationBlock *pTVar4;
  bool bVar5;
  target_ulong tVar6;
  _Bool _Var7;
  int iVar8;
  uint uVar9;
  uintptr_t o_1;
  undefined1 *puVar10;
  list_item *plVar11;
  TCGv_i32 pTVar12;
  TCGv_i64 pTVar13;
  TCGv_i64 pTVar14;
  TCGLabel *pTVar15;
  TCGTemp *pTVar16;
  gpointer pvVar17;
  ulong *puVar18;
  ulong uVar19;
  uintptr_t o_2;
  TCGTemp *pTVar20;
  CPUBreakpoint *pCVar21;
  anon_union_16_2_88bb8dd4_for_ops_free_ops *paVar22;
  uintptr_t o;
  TCGTemp *ts;
  void *local_a8;
  int local_98;
  TCGTemp *local_88;
  TCGTemp *local_80;
  TCGTemp *local_78;
  TCGTemp *local_70;
  TCGTemp *local_68;
  TranslatorOps_conflict *local_60;
  TCGTemp *local_58;
  TCGTemp *local_50;
  TCGTemp *local_48;
  TCGTemp *local_40;
  
  val = cpu->uc;
  s = val->tcg_ctx;
  db->tb = tb;
  uVar1 = (undefined4)tb->pc;
  *(undefined4 *)&db->pc_first = uVar1;
  *(undefined4 *)((long)&db->pc_first + 4) = uVar1;
  db->is_jmp = DISAS_NEXT;
  db->num_insns = 0;
  db->max_insns = max_insns;
  db->singlestep_enabled = cpu->singlestep_enabled != 0;
  (*ops->init_disas_context)(db,cpu);
  local_88 = (TCGTemp *)(ulong)(uint)tb->pc;
  if (val->use_exits == 0) {
    if ((TCGTemp *)val->exits[(long)val->nested_level + -1] == local_88) goto LAB_0070fa86;
  }
  else {
    puVar10 = (undefined1 *)g_tree_lookup(val->ctl_exits,&local_88);
    if (puVar10 == &DAT_00000001) {
LAB_0070fa86:
      pTVar15 = gen_new_label_m68k((TCGContext_conflict2 *)s);
      s->exitreq_label = pTVar15;
      local_98 = 0;
      pTVar16 = tcg_temp_new_internal_m68k((TCGContext_conflict2 *)s,TCG_TYPE_I32,false);
      tcg_gen_op3_m68k((TCGContext_conflict2 *)s,INDEX_op_ld_i32,(TCGArg)pTVar16,
                       (long)&s->pool_cur + s->gen_insn_data[0xad][0],0xfffffffffffffff0);
      tcg_gen_brcondi_i32_m68k
                ((TCGContext_conflict2 *)s,TCG_COND_LT,(TCGv_i32)((long)pTVar16 - (long)s),0,
                 s->exitreq_label);
      tcg_temp_free_internal_m68k((TCGContext_conflict2 *)s,pTVar16);
      (*ops->tb_start)(db,cpu);
      db->num_insns = db->num_insns + 1;
      (*ops->insn_start)(db,cpu);
      (*ops->translate_insn)(db,cpu);
      local_a8 = (void *)0x0;
      bVar5 = false;
      goto LAB_0070fd95;
    }
  }
  plVar11 = val->hook[3].head;
  local_98 = 0;
  local_60 = ops;
  if (plVar11 != (list_item *)0x0) {
    uVar19 = (ulong)(uint)tb->pc;
LAB_0070fa1b:
    pvVar2 = plVar11->data;
    if ((*(ulong *)((long)pvVar2 + 0x18) <= *(ulong *)((long)pvVar2 + 0x20) &&
         (*(ulong *)((long)pvVar2 + 0x20) < uVar19 || uVar19 < *(ulong *)((long)pvVar2 + 0x18))) ||
       (*(char *)((long)pvVar2 + 0x14) == '\x01')) goto LAB_0070fa52;
    local_a8 = ((s->ops).tqh_circ.tql_prev)->tql_prev->tql_next;
    tVar6 = db->pc_first;
    pTVar12 = tcg_const_i32_m68k((TCGContext_conflict2 *)s,-0x7070708);
    pTVar13 = tcg_const_i64_m68k((TCGContext_conflict2 *)s,(int64_t)val);
    pTVar14 = tcg_const_i64_m68k((TCGContext_conflict2 *)s,(ulong)(uint)tVar6);
    ts = (TCGTemp *)(pTVar13 + (long)s);
    pTVar16 = (TCGTemp *)(pTVar14 + (long)s);
    pTVar20 = (TCGTemp *)(pTVar12 + (long)s);
    local_40 = (TCGTemp *)0x0;
    local_68 = pTVar20;
    local_58 = ts;
    local_50 = pTVar16;
    local_48 = pTVar20;
    if (val->hooks_count[3] == 1) {
      for (plVar11 = val->hook[3].head; plVar11 != (list_item *)0x0; plVar11 = plVar11->next) {
        phVar3 = (hook *)plVar11->data;
        if (phVar3->to_delete == false) {
          pTVar13 = tcg_const_i64_m68k((TCGContext_conflict2 *)s,(int64_t)phVar3->user_data);
          local_40 = (TCGTemp *)(pTVar13 + (long)s);
          (*val->add_inline_hook)(val,phVar3,&local_58,4);
          tcg_temp_free_internal_m68k((TCGContext_conflict2 *)s,(TCGTemp *)(pTVar13 + (long)s));
        }
      }
    }
    else {
      pTVar12 = tcg_const_i32_m68k((TCGContext_conflict2 *)s,3);
      local_88 = pTVar20;
      local_80 = (TCGTemp *)(pTVar12 + (long)s);
      local_78 = ts;
      local_70 = pTVar16;
      tcg_gen_callN_m68k((TCGContext_conflict2 *)s,helper_uc_tracecode,(TCGTemp *)0x0,4,&local_88);
      tcg_temp_free_internal_m68k((TCGContext_conflict2 *)s,(TCGTemp *)(pTVar12 + (long)s));
    }
    tcg_temp_free_internal_m68k((TCGContext_conflict2 *)s,pTVar16);
    tcg_temp_free_internal_m68k((TCGContext_conflict2 *)s,ts);
    tcg_temp_free_internal_m68k((TCGContext_conflict2 *)s,local_68);
    bVar5 = true;
    goto LAB_0070fc96;
  }
LAB_0070fa5a:
  local_a8 = (void *)0x0;
  bVar5 = false;
LAB_0070fc96:
  pTVar15 = gen_new_label_m68k((TCGContext_conflict2 *)s);
  s->exitreq_label = pTVar15;
  pTVar16 = tcg_temp_new_internal_m68k((TCGContext_conflict2 *)s,TCG_TYPE_I32,false);
  tcg_gen_op3_m68k((TCGContext_conflict2 *)s,INDEX_op_ld_i32,(TCGArg)pTVar16,
                   (long)&s->pool_cur + s->gen_insn_data[0xad][0],0xfffffffffffffff0);
  tcg_gen_brcondi_i32_m68k
            ((TCGContext_conflict2 *)s,TCG_COND_LT,(TCGv_i32)((long)pTVar16 - (long)s),0,
             s->exitreq_label);
  tcg_temp_free_internal_m68k((TCGContext_conflict2 *)s,pTVar16);
  ops = local_60;
  (*local_60->tb_start)(db,cpu);
  iVar8 = db->num_insns;
  do {
    db->num_insns = iVar8 + 1;
    (*ops->insn_start)(db,cpu);
    if ((db->singlestep_enabled == false) &&
       (pCVar21 = (cpu->breakpoints).tqh_first, pCVar21 != (CPUBreakpoint *)0x0)) {
      do {
        if ((pCVar21->pc == (ulong)*(uint *)((long)&db->pc_first + 4)) &&
           (_Var7 = (*ops->breakpoint_check)(db,cpu,pCVar21), _Var7)) {
          local_98 = 1;
          break;
        }
        pCVar21 = (pCVar21->entry).tqe_next;
      } while (pCVar21 != (CPUBreakpoint *)0x0);
      if (DISAS_TOO_MANY < db->is_jmp) goto LAB_0070fd95;
    }
    (*ops->translate_insn)(db,cpu);
    if (db->is_jmp != DISAS_NEXT) goto LAB_0070fd95;
  } while ((s->nb_ops < 4000) && (iVar8 = db->num_insns, iVar8 < db->max_insns));
  db->is_jmp = DISAS_TOO_MANY;
LAB_0070fd95:
  (*ops->tb_stop)(db,cpu);
  pTVar4 = db->tb;
  if ((pTVar4->flags & 0x20000) != 0) {
    *(long *)(s->gen_insn_data[0xac][0] + 0x20) = (long)db->num_insns - (long)local_98;
  }
  pTVar15 = s->exitreq_label;
  *(uint *)pTVar15 = *(uint *)pTVar15 | 1;
  tcg_gen_op1_m68k((TCGContext_conflict2 *)s,INDEX_op_set_label,(TCGArg)pTVar15);
  tcg_gen_exit_tb_m68k((TCGContext_conflict2 *)s,pTVar4,3);
  uVar9 = *(int *)((long)&db->pc_first + 4) - (int)db->pc_first;
  pTVar4 = db->tb;
  *(short *)((long)&pTVar4->cs_base + 4) = (short)uVar9;
  *(short *)((long)&pTVar4->cs_base + 6) = (short)db->num_insns;
  pTVar16 = (TCGTemp *)(ulong)(uint)pTVar4->pc;
  uVar19 = (ulong)(uVar9 & 0xffff);
  for (plVar11 = val->hook[2].head; plVar11 != (list_item *)0x0; plVar11 = plVar11->next) {
    pvVar2 = plVar11->data;
    if (((*(TCGTemp **)((long)pvVar2 + 0x20) < *(TCGTemp **)((long)pvVar2 + 0x18) ||
          pTVar16 <= *(TCGTemp **)((long)pvVar2 + 0x20) &&
          *(TCGTemp **)((long)pvVar2 + 0x18) <= pTVar16) && (*(char *)((long)pvVar2 + 0x14) == '\0')
        ) && (local_88 = pTVar16, local_80 = (TCGTemp *)uVar19,
             pvVar17 = g_hash_table_lookup(*(GHashTable **)((long)pvVar2 + 0x38),&local_88),
             pvVar17 == (gpointer)0x0)) {
      puVar18 = (ulong *)malloc(0x10);
      *puVar18 = (ulong)pTVar16;
      puVar18[1] = uVar19;
      g_hash_table_insert(*(GHashTable **)((long)pvVar2 + 0x38),puVar18,&DAT_00000001);
    }
  }
  for (plVar11 = val->hook[3].head; plVar11 != (list_item *)0x0; plVar11 = plVar11->next) {
    pvVar2 = plVar11->data;
    if (((*(TCGTemp **)((long)pvVar2 + 0x20) < *(TCGTemp **)((long)pvVar2 + 0x18) ||
          pTVar16 <= *(TCGTemp **)((long)pvVar2 + 0x20) &&
          *(TCGTemp **)((long)pvVar2 + 0x18) <= pTVar16) && (*(char *)((long)pvVar2 + 0x14) == '\0')
        ) && (local_88 = pTVar16, local_80 = (TCGTemp *)uVar19,
             pvVar17 = g_hash_table_lookup(*(GHashTable **)((long)pvVar2 + 0x38),&local_88),
             pvVar17 == (gpointer)0x0)) {
      puVar18 = (ulong *)malloc(0x10);
      *puVar18 = (ulong)pTVar16;
      puVar18[1] = uVar19;
      g_hash_table_insert(*(GHashTable **)((long)pvVar2 + 0x38),puVar18,&DAT_00000001);
    }
  }
  if (bVar5) {
    paVar22 = &s->ops;
    if (local_a8 != (void *)0x0) {
      paVar22 = (anon_union_16_2_88bb8dd4_for_ops_free_ops *)((long)local_a8 + 8);
    }
    paVar22->tqh_first->args[1] = (ulong)*(ushort *)((long)&db->tb->cs_base + 4);
  }
  return;
LAB_0070fa52:
  plVar11 = plVar11->next;
  if (plVar11 == (list_item *)0x0) goto LAB_0070fa5a;
  goto LAB_0070fa1b;
}

Assistant:

void translator_loop(const TranslatorOps *ops, DisasContextBase *db,
                     CPUState *cpu, TranslationBlock *tb, int max_insns)
{
    int bp_insn = 0;
    struct uc_struct *uc = (struct uc_struct *)cpu->uc;
    TCGContext *tcg_ctx = uc->tcg_ctx;
    TCGOp *prev_op = NULL;
    bool block_hook = false;

    /* Initialize DisasContext */
    db->tb = tb;
    db->pc_first = tb->pc;
    db->pc_next = db->pc_first;
    db->is_jmp = DISAS_NEXT;
    db->num_insns = 0;
    db->max_insns = max_insns;
    db->singlestep_enabled = cpu->singlestep_enabled;

    ops->init_disas_context(db, cpu);
    tcg_debug_assert(db->is_jmp == DISAS_NEXT);  /* no early exit */

    /* Reset the temp count so that we can identify leaks */
    tcg_clear_temp_count();

    /* Unicorn: early check to see if the address of this block is
     * the "run until" address. */
    if (uc_addr_is_exit(uc, tb->pc)) {
        // This should catch that instruction is at the end
        // and generate appropriate halting code.
        gen_tb_start(tcg_ctx, db->tb);
        ops->tb_start(db, cpu);
        db->num_insns++;
        ops->insn_start(db, cpu);
        ops->translate_insn(db, cpu);
        goto _end_loop;
    }

    /* Unicorn: trace this block on request
     * Only hook this block if it is not broken from previous translation due to
     * full translation cache
     */
    if (HOOK_EXISTS_BOUNDED(uc, UC_HOOK_BLOCK, tb->pc)) {
        prev_op = tcg_last_op(tcg_ctx);
        block_hook = true;
        gen_uc_tracecode(tcg_ctx, 0xf8f8f8f8, UC_HOOK_BLOCK_IDX, uc, db->pc_first);
    }

    // tcg_dump_ops(tcg_ctx, false, "translator loop");

    /* Start translating.  */
    gen_tb_start(tcg_ctx, db->tb);
    // tcg_dump_ops(tcg_ctx, false, "tb start");

    ops->tb_start(db, cpu);
    // tcg_dump_ops(tcg_ctx, false, "tb start 2");

    tcg_debug_assert(db->is_jmp == DISAS_NEXT);  /* no early exit */

    while (true) {
        db->num_insns++;

        ops->insn_start(db, cpu);
        tcg_debug_assert(db->is_jmp == DISAS_NEXT);  /* no early exit */

        /* Pass breakpoint hits to target for further processing */
        if (!db->singlestep_enabled
            && unlikely(!QTAILQ_EMPTY(&cpu->breakpoints))) {
            CPUBreakpoint *bp;
            QTAILQ_FOREACH(bp, &cpu->breakpoints, entry) {
                if (bp->pc == db->pc_next) {
                    if (ops->breakpoint_check(db, cpu, bp)) {
                        bp_insn = 1;
                        break;
                    }
                }
            }
            /* The breakpoint_check hook may use DISAS_TOO_MANY to indicate
               that only one more instruction is to be executed.  Otherwise
               it should use DISAS_NORETURN when generating an exception,
               but may use a DISAS_TARGET_* value for Something Else.  */
            if (db->is_jmp > DISAS_TOO_MANY) {
                break;
            }
        }

        /* Disassemble one instruction.  The translate_insn hook should
           update db->pc_next and db->is_jmp to indicate what should be
           done next -- either exiting this loop or locate the start of
           the next instruction.  */
        ops->translate_insn(db, cpu);
        // tcg_dump_ops(tcg_ctx, false, "insn translate");

        /* Stop translation if translate_insn so indicated.  */
        if (db->is_jmp != DISAS_NEXT) {
            break;
        }

        /* Stop translation if the output buffer is full,
           or we have executed all of the allowed instructions.  */
        if (tcg_op_buf_full(tcg_ctx) || db->num_insns >= db->max_insns) {
            db->is_jmp = DISAS_TOO_MANY;
            break;
        }
    }

_end_loop:
    /* Emit code to exit the TB, as indicated by db->is_jmp.  */
    ops->tb_stop(db, cpu);
    gen_tb_end(tcg_ctx, db->tb, db->num_insns - bp_insn);
    // tcg_dump_ops(tcg_ctx, false, "tb end");

    /* The disas_log hook may use these values rather than recompute.  */
    db->tb->size = db->pc_next - db->pc_first;
    db->tb->icount = db->num_insns;

    hooked_regions_check(uc, db->tb->pc, db->tb->size);

    if (block_hook) {
        TCGOp *tcg_op;

        // Unicorn: patch the callback to have the proper block size.
        if (prev_op) {
            // As explained further up in the function where prev_op is
            // assigned, we move forward in the tail queue, so we're modifying the
            // move instruction generated by gen_uc_tracecode() that contains
            // the instruction size to assign the proper size (replacing 0xF1F1F1F1).
            tcg_op = QTAILQ_NEXT(prev_op, link);
        } else {
            // this basic block is the first emulated code ever,
            // so the basic block operand is the first operand
            tcg_op = QTAILQ_FIRST(&tcg_ctx->ops);
        }

        tcg_op->args[1] = db->tb->size;
    }
}